

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seq.cc
# Opt level: O2

bool xt::seq::contains(Seq *s,Object *o)

{
  element_type *peVar1;
  __shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2> local_48;
  double local_38;
  
  while (peVar1 = (s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
        peVar1 != (element_type *)0x0) {
    (**peVar1->_vptr_ISeq)(&local_48,peVar1);
    if (((Type)local_48._M_ptr == o->type) &&
       (local_48._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)o->typeinfo))
    {
      if ((local_38 == (o->field_2).number) && (!NAN(local_38) && !NAN((o->field_2).number))) break;
    }
    (*((s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_ISeq[1])
              (&local_48);
    std::__shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&s->super___shared_ptr<xt::ISeq,_(__gnu_cxx::_Lock_policy)2>,&local_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48._M_refcount);
  }
  return peVar1 != (element_type *)0x0;
}

Assistant:

bool contains(Seq s, Object o) {
	while (s) {
		if (s->first() == o) return true;
		s = s->next();
	}
	return false;
}